

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase272::run(TestCase272 *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  ReaderFor<bool> RVar5;
  BuilderFor<bool> BVar6;
  int32_t iVar7;
  int64_t iVar8;
  char *pcVar9;
  ReaderFor<Text> RVar10;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StringPtr name_11;
  StringPtr name_12;
  StringPtr name_13;
  StringPtr name_14;
  StringPtr name_15;
  StringPtr name_16;
  StringPtr name_17;
  StringPtr name_18;
  StringPtr name_19;
  StringPtr name_20;
  Reader value;
  ArrayPtr<const_char> local_258;
  Reader local_248;
  undefined1 local_1f8 [31];
  SegmentReader *pSStack_1d9;
  SegmentReader *local_1d1;
  SegmentBuilder *pSStack_1c9;
  SegmentReader *local_1c1;
  SegmentReader *pSStack_1b9;
  ReaderFor<capnp::DynamicStruct> u;
  Builder root;
  ReaderFor<DynamicTypeFor<FromReader<Reader>_>_> dynamic;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestUnion>
            (&root,&builder.super_MessageBuilder);
  *(undefined2 *)root._builder.data = 0xb;
  *(undefined4 *)((long)root._builder.data + 8) = 0x12d687;
  local_248.field_1.listValue.reader.capTable = (CapTableReader *)root._builder._32_8_;
  local_248.field_1.structValue.reader.segment = (SegmentReader *)root._builder.data;
  local_248.field_1.anyPointerValue.reader.pointer = root._builder.pointers;
  local_248._0_8_ = root._builder.segment;
  local_248.field_1.anyPointerValue.reader.segment = (SegmentReader *)root._builder.capTable;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  capnproto_test::capnp::test::TestUnion::Union1::Builder::setU1f1sp((Builder *)&local_248,value);
  *(undefined2 *)((long)root._builder.data + 4) = 0;
  *(byte *)((long)root._builder.data + 0x20) = *(byte *)((long)root._builder.data + 0x20) | 1;
  *(undefined2 *)((long)root._builder.data + 6) = 4;
  *(undefined8 *)((long)root._builder.data + 0x38) = 0x112210f47de98115;
  StructBuilder::asReader(&root._builder);
  dynamic.reader._32_8_ = local_248.field_1.listValue.reader.capTable;
  dynamic.reader._40_8_ = local_248.field_1.listValue.reader.ptr;
  dynamic.reader.data = local_248.field_1.structValue.reader.segment;
  dynamic.reader.pointers = local_248.field_1.anyPointerValue.reader.pointer;
  dynamic.reader.segment = (SegmentReader *)local_248._0_8_;
  dynamic.reader.capTable = (CapTableReader *)local_248.field_1.anyPointerValue.reader.segment;
  dynamic.schema.super_Schema.raw = (Schema)((long)schemas::s_f47697362233ce52 + 0x48);
  name.content.size_ = 7;
  name.content.ptr = "union0";
  DynamicStruct::Reader::get(&local_248,&dynamic,name);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&u,&local_248);
  DynamicValue::Reader::~Reader(&local_248);
  DynamicStruct::Reader::which((Maybe<capnp::StructSchema::Field> *)&local_248,&u);
  uVar3 = local_248.field_1.listValue.reader.ptr;
  uVar2 = local_248.field_1.listValue.reader.capTable;
  uVar1 = local_248.field_1.anyPointerValue.reader.pointer;
  if ((undefined1)local_248.type == VOID) {
    local_1c1 = (SegmentReader *)local_248.field_1._48_8_;
    pSStack_1b9 = (SegmentReader *)local_248.field_1._56_8_;
    local_1d1 = (SegmentReader *)local_248.field_1.listValue.reader.ptr;
    pSStack_1c9 = (SegmentBuilder *)local_248.field_1._40_8_;
    local_1f8._23_8_ = local_248.field_1.listValue.reader.segment;
    pSStack_1d9 = (SegmentReader *)local_248.field_1.listValue.reader.capTable;
    local_1f8[7] = (undefined1)local_248.field_1.intValue;
    local_1f8._8_7_ = (undefined7)((ulong)local_248.field_1._0_8_ >> 8);
    local_1f8[0xf] = (undefined1)local_248.field_1.textValue.super_StringPtr.content.size_;
    local_1f8._16_7_ = (undefined7)((ulong)local_248.field_1._8_8_ >> 8);
    local_248.field_1._24_8_ = local_248.field_1._48_8_;
    local_248.field_1._32_8_ = local_248.field_1._56_8_;
    local_248.field_1.textValue.super_StringPtr.content.size_ = uVar3;
    local_248.field_1._16_8_ = local_248.field_1._40_8_;
    local_248._0_8_ = uVar1;
    local_248.field_1.intValue = uVar2;
    local_258 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)&local_248);
    bVar4 = kj::operator==("u0f1s32",(StringPtr *)&local_258);
    if (!bVar4 && kj::_::Debug::minSeverity < 3) {
      local_248.field_1.listValue.reader.capTable = (CapTableReader *)local_1c1;
      local_248.field_1.listValue.reader.ptr = (byte *)pSStack_1b9;
      local_248.field_1.textValue.super_StringPtr.content.size_ = (size_t)local_1d1;
      local_248.field_1.listValue.reader.segment = &pSStack_1c9->super_SegmentReader;
      local_248._0_8_ = local_1f8._23_8_;
      local_248.field_1.intValue = (int64_t)pSStack_1d9;
      local_258 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)&local_248);
      kj::_::Debug::log<char_const(&)[58],char_const(&)[8],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x11d,ERROR,
                 "\"failed: expected \" \"(\\\"u0f1s32\\\") == (w->getProto().getName())\", \"u0f1s32\", w->getProto().getName()"
                 ,(char (*) [58])"failed: expected (\"u0f1s32\") == (w->getProto().getName())",
                 (char (*) [8])"u0f1s32",(Reader *)&local_258);
    }
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[17]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x11d,ERROR,"\"Maybe was empty.\"",(char (*) [17])"Maybe was empty.");
  }
  name_00.content.size_ = 8;
  name_00.content.ptr = "u0f1s32";
  DynamicStruct::Reader::get(&local_248,&u,name_00);
  iVar7 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply(&local_248);
  DynamicValue::Reader::~Reader(&local_248);
  if ((iVar7 != 0x12d687) && (kj::_::Debug::minSeverity < 3)) {
    local_1f8._0_4_ = 0x12d687;
    name_01.content.size_ = 8;
    name_01.content.ptr = "u0f1s32";
    DynamicStruct::Reader::get(&local_248,&u,name_01);
    iVar7 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply(&local_248);
    local_258.ptr._0_4_ = iVar7;
    kj::_::Debug::log<char_const(&)[63],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x11e,ERROR,
               "\"failed: expected \" \"(1234567) == (u.get(\\\"u0f1s32\\\").as<int32_t>())\", 1234567, u.get(\"u0f1s32\").as<int32_t>()"
               ,(char (*) [63])"failed: expected (1234567) == (u.get(\"u0f1s32\").as<int32_t>())",
               (int *)local_1f8,(int *)&local_258);
    DynamicValue::Reader::~Reader(&local_248);
  }
  name_02.content.size_ = 7;
  name_02.content.ptr = "union1";
  DynamicStruct::Reader::get(&local_248,&dynamic,name_02);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&u,&local_248);
  DynamicValue::Reader::~Reader(&local_248);
  DynamicStruct::Reader::which((Maybe<capnp::StructSchema::Field> *)&local_248,&u);
  uVar3 = local_248.field_1.listValue.reader.ptr;
  uVar2 = local_248.field_1.listValue.reader.capTable;
  uVar1 = local_248.field_1.listValue.reader.segment;
  if ((undefined1)local_248.type == VOID) {
    local_1c1 = (SegmentReader *)local_248.field_1._48_8_;
    pSStack_1b9 = (SegmentReader *)local_248.field_1._56_8_;
    local_1d1 = (SegmentReader *)local_248.field_1.listValue.reader.ptr;
    pSStack_1c9 = (SegmentBuilder *)local_248.field_1._40_8_;
    local_1f8._23_8_ = local_248.field_1.listValue.reader.segment;
    pSStack_1d9 = (SegmentReader *)local_248.field_1.listValue.reader.capTable;
    local_1f8[7] = (undefined1)local_248.field_1.intValue;
    local_1f8._8_7_ = (undefined7)((ulong)local_248.field_1._0_8_ >> 8);
    local_1f8[0xf] = (undefined1)local_248.field_1.textValue.super_StringPtr.content.size_;
    local_1f8._16_7_ = (undefined7)((ulong)local_248.field_1._8_8_ >> 8);
    local_248.field_1._24_8_ = local_248.field_1._48_8_;
    local_248.field_1._32_8_ = local_248.field_1._56_8_;
    local_248.field_1.textValue.super_StringPtr.content.size_ = uVar3;
    local_248.field_1._16_8_ = local_248.field_1._40_8_;
    local_248._0_8_ = uVar1;
    local_248.field_1.intValue = uVar2;
    local_258 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)&local_248);
    bVar4 = kj::operator==("u1f1sp",(StringPtr *)&local_258);
    if (!bVar4 && kj::_::Debug::minSeverity < 3) {
      local_248.field_1.listValue.reader.capTable = (CapTableReader *)local_1c1;
      local_248.field_1.listValue.reader.ptr = (byte *)pSStack_1b9;
      local_248.field_1.textValue.super_StringPtr.content.size_ = (size_t)local_1d1;
      local_248.field_1.listValue.reader.segment = &pSStack_1c9->super_SegmentReader;
      local_248._0_8_ = local_1f8._23_8_;
      local_248.field_1.intValue = (int64_t)pSStack_1d9;
      local_258 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)&local_248);
      kj::_::Debug::log<char_const(&)[57],char_const(&)[7],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x122,ERROR,
                 "\"failed: expected \" \"(\\\"u1f1sp\\\") == (w->getProto().getName())\", \"u1f1sp\", w->getProto().getName()"
                 ,(char (*) [57])"failed: expected (\"u1f1sp\") == (w->getProto().getName())",
                 (char (*) [7])"u1f1sp",(Reader *)&local_258);
    }
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[17]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x122,ERROR,"\"Maybe was empty.\"",(char (*) [17])"Maybe was empty.");
  }
  name_03.content.size_ = 7;
  name_03.content.ptr = "u1f1sp";
  DynamicStruct::Reader::get(&local_248,&u,name_03);
  RVar10 = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply(&local_248);
  local_1f8._0_4_ = RVar10.super_StringPtr.content.ptr._0_4_;
  local_1f8._4_4_ = RVar10.super_StringPtr.content.ptr._4_4_;
  local_1f8._8_7_ = (undefined7)RVar10.super_StringPtr.content.size_;
  local_1f8[0xf] = RVar10.super_StringPtr.content.size_._7_1_;
  bVar4 = kj::operator==("foo",(StringPtr *)local_1f8);
  DynamicValue::Reader::~Reader(&local_248);
  if (!bVar4 && kj::_::Debug::minSeverity < 3) {
    name_04.content.size_ = 7;
    name_04.content.ptr = "u1f1sp";
    DynamicStruct::Reader::get(&local_248,&u,name_04);
    RVar10 = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply(&local_248);
    local_1f8._0_4_ = RVar10.super_StringPtr.content.ptr._0_4_;
    local_1f8._4_4_ = RVar10.super_StringPtr.content.ptr._4_4_;
    local_1f8._8_7_ = (undefined7)RVar10.super_StringPtr.content.size_;
    local_1f8[0xf] = RVar10.super_StringPtr.content.size_._7_1_;
    kj::_::Debug::log<char_const(&)[57],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x123,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (u.get(\\\"u1f1sp\\\").as<Text>())\", \"foo\", u.get(\"u1f1sp\").as<Text>()"
               ,(char (*) [57])"failed: expected (\"foo\") == (u.get(\"u1f1sp\").as<Text>())",
               (char (*) [4])0x4f93d8,(Reader *)local_1f8);
    DynamicValue::Reader::~Reader(&local_248);
  }
  name_05.content.size_ = 7;
  name_05.content.ptr = "union2";
  DynamicStruct::Reader::get(&local_248,&dynamic,name_05);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&u,&local_248);
  DynamicValue::Reader::~Reader(&local_248);
  DynamicStruct::Reader::which((Maybe<capnp::StructSchema::Field> *)&local_248,&u);
  uVar3 = local_248.field_1.listValue.reader.ptr;
  uVar2 = local_248.field_1.listValue.reader.capTable;
  uVar1 = local_248.field_1.listValue.reader.segment;
  if ((undefined1)local_248.type == VOID) {
    local_1c1 = (SegmentReader *)local_248.field_1._48_8_;
    pSStack_1b9 = (SegmentReader *)local_248.field_1._56_8_;
    local_1d1 = (SegmentReader *)local_248.field_1.listValue.reader.ptr;
    pSStack_1c9 = (SegmentBuilder *)local_248.field_1._40_8_;
    local_1f8._23_8_ = local_248.field_1.listValue.reader.segment;
    pSStack_1d9 = (SegmentReader *)local_248.field_1.listValue.reader.capTable;
    local_1f8[7] = (undefined1)local_248.field_1.intValue;
    local_1f8._8_7_ = (undefined7)((ulong)local_248.field_1._0_8_ >> 8);
    local_1f8[0xf] = (undefined1)local_248.field_1.textValue.super_StringPtr.content.size_;
    local_1f8._16_7_ = (undefined7)((ulong)local_248.field_1._8_8_ >> 8);
    local_248.field_1._24_8_ = local_248.field_1._48_8_;
    local_248.field_1._32_8_ = local_248.field_1._56_8_;
    local_248.field_1.textValue.super_StringPtr.content.size_ = uVar3;
    local_248.field_1._16_8_ = local_248.field_1._40_8_;
    local_248._0_8_ = uVar1;
    local_248.field_1.intValue = uVar2;
    local_258 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)&local_248);
    bVar4 = kj::operator==("u2f0s1",(StringPtr *)&local_258);
    if (!bVar4 && kj::_::Debug::minSeverity < 3) {
      local_248.field_1.listValue.reader.capTable = (CapTableReader *)local_1c1;
      local_248.field_1.listValue.reader.ptr = (byte *)pSStack_1b9;
      local_248.field_1.textValue.super_StringPtr.content.size_ = (size_t)local_1d1;
      local_248.field_1.listValue.reader.segment = &pSStack_1c9->super_SegmentReader;
      local_248._0_8_ = local_1f8._23_8_;
      local_248.field_1.intValue = (int64_t)pSStack_1d9;
      local_258 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)&local_248);
      kj::_::Debug::log<char_const(&)[57],char_const(&)[7],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x127,ERROR,
                 "\"failed: expected \" \"(\\\"u2f0s1\\\") == (w->getProto().getName())\", \"u2f0s1\", w->getProto().getName()"
                 ,(char (*) [57])"failed: expected (\"u2f0s1\") == (w->getProto().getName())",
                 (char (*) [7])"u2f0s1",(Reader *)&local_258);
    }
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[17]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x127,ERROR,"\"Maybe was empty.\"",(char (*) [17])"Maybe was empty.");
  }
  name_06.content.size_ = 7;
  name_06.content.ptr = "u2f0s1";
  DynamicStruct::Reader::get(&local_248,&u,name_06);
  RVar5 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply(&local_248);
  DynamicValue::Reader::~Reader(&local_248);
  if (!RVar5 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[44]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x128,ERROR,"\"failed: expected \" \"u.get(\\\"u2f0s1\\\").as<bool>()\"",
               (char (*) [44])"failed: expected u.get(\"u2f0s1\").as<bool>()");
  }
  name_07.content.size_ = 7;
  name_07.content.ptr = "union3";
  DynamicStruct::Reader::get(&local_248,&dynamic,name_07);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&u,&local_248);
  DynamicValue::Reader::~Reader(&local_248);
  DynamicStruct::Reader::which((Maybe<capnp::StructSchema::Field> *)&local_248,&u);
  uVar3 = local_248.field_1.listValue.reader.ptr;
  uVar2 = local_248.field_1.listValue.reader.capTable;
  uVar1 = local_248.field_1.listValue.reader.segment;
  if ((undefined1)local_248.type == VOID) {
    local_1c1 = (SegmentReader *)local_248.field_1._48_8_;
    pSStack_1b9 = (SegmentReader *)local_248.field_1._56_8_;
    local_1d1 = (SegmentReader *)local_248.field_1.listValue.reader.ptr;
    pSStack_1c9 = (SegmentBuilder *)local_248.field_1._40_8_;
    local_1f8._23_8_ = local_248.field_1.listValue.reader.segment;
    pSStack_1d9 = (SegmentReader *)local_248.field_1.listValue.reader.capTable;
    local_1f8[7] = (undefined1)local_248.field_1.intValue;
    local_1f8._8_7_ = (undefined7)((ulong)local_248.field_1._0_8_ >> 8);
    local_1f8[0xf] = (undefined1)local_248.field_1.textValue.super_StringPtr.content.size_;
    local_1f8._16_7_ = (undefined7)((ulong)local_248.field_1._8_8_ >> 8);
    local_248.field_1._24_8_ = local_248.field_1._48_8_;
    local_248.field_1._32_8_ = local_248.field_1._56_8_;
    local_248.field_1.textValue.super_StringPtr.content.size_ = uVar3;
    local_248.field_1._16_8_ = local_248.field_1._40_8_;
    local_248._0_8_ = uVar1;
    local_248.field_1.intValue = uVar2;
    local_258 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)&local_248);
    bVar4 = kj::operator==("u3f0s64",(StringPtr *)&local_258);
    if (!bVar4 && kj::_::Debug::minSeverity < 3) {
      local_248.field_1.listValue.reader.capTable = (CapTableReader *)local_1c1;
      local_248.field_1.listValue.reader.ptr = (byte *)pSStack_1b9;
      local_248.field_1.textValue.super_StringPtr.content.size_ = (size_t)local_1d1;
      local_248.field_1.listValue.reader.segment = &pSStack_1c9->super_SegmentReader;
      local_248._0_8_ = local_1f8._23_8_;
      local_248.field_1.intValue = (int64_t)pSStack_1d9;
      local_258 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)&local_248);
      kj::_::Debug::log<char_const(&)[58],char_const(&)[8],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,300,ERROR,
                 "\"failed: expected \" \"(\\\"u3f0s64\\\") == (w->getProto().getName())\", \"u3f0s64\", w->getProto().getName()"
                 ,(char (*) [58])"failed: expected (\"u3f0s64\") == (w->getProto().getName())",
                 (char (*) [8])"u3f0s64",(Reader *)&local_258);
    }
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[17]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,300,ERROR,"\"Maybe was empty.\"",(char (*) [17])"Maybe was empty.");
  }
  name_08.content.size_ = 8;
  name_08.content.ptr = "u3f0s64";
  DynamicStruct::Reader::get(&local_248,&u,name_08);
  iVar8 = DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply(&local_248);
  DynamicValue::Reader::~Reader(&local_248);
  if ((iVar8 != 0x112210f47de98115) && (kj::_::Debug::minSeverity < 3)) {
    local_1f8._0_4_ = 0x7de98115;
    local_1f8._4_4_ = 0x112210f4;
    name_09.content.size_ = 8;
    name_09.content.ptr = "u3f0s64";
    DynamicStruct::Reader::get(&local_248,&u,name_09);
    pcVar9 = (char *)DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply(&local_248);
    local_258.ptr = pcVar9;
    kj::_::Debug::log<char_const(&)[77],long_long,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x12d,ERROR,
               "\"failed: expected \" \"(1234567890123456789ll) == (u.get(\\\"u3f0s64\\\").as<int64_t>())\", 1234567890123456789ll, u.get(\"u3f0s64\").as<int64_t>()"
               ,(char (*) [77])
                "failed: expected (1234567890123456789ll) == (u.get(\"u3f0s64\").as<int64_t>())",
               (longlong *)local_1f8,(long *)&local_258);
    DynamicValue::Reader::~Reader(&local_248);
  }
  dynamic.reader.dataSize = root._builder.dataSize;
  dynamic.reader.pointerCount = root._builder.pointerCount;
  dynamic.reader._38_2_ = root._builder._38_2_;
  dynamic.reader.data = root._builder.data;
  dynamic.reader.pointers = root._builder.pointers;
  dynamic.reader.segment = &(root._builder.segment)->super_SegmentReader;
  dynamic.reader.capTable = &(root._builder.capTable)->super_CapTableReader;
  dynamic.schema.super_Schema.raw = (Schema)((long)schemas::s_f47697362233ce52 + 0x48);
  name_10.content.size_ = 7;
  name_10.content.ptr = "union0";
  DynamicStruct::Builder::get((Builder *)&local_248,(Builder *)&dynamic,name_10);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&u,(Builder *)&local_248);
  DynamicValue::Builder::~Builder((Builder *)&local_248);
  DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)&local_248,(Builder *)&u);
  uVar3 = local_248.field_1.listValue.reader.ptr;
  uVar2 = local_248.field_1.listValue.reader.capTable;
  uVar1 = local_248.field_1.listValue.reader.segment;
  if ((undefined1)local_248.type == VOID) {
    local_1c1 = (SegmentReader *)local_248.field_1._48_8_;
    pSStack_1b9 = (SegmentReader *)local_248.field_1._56_8_;
    local_1d1 = (SegmentReader *)local_248.field_1.listValue.reader.ptr;
    pSStack_1c9 = (SegmentBuilder *)local_248.field_1._40_8_;
    local_1f8._23_8_ = local_248.field_1.listValue.reader.segment;
    pSStack_1d9 = (SegmentReader *)local_248.field_1.listValue.reader.capTable;
    local_1f8[7] = (undefined1)local_248.field_1.intValue;
    local_1f8._8_7_ = (undefined7)((ulong)local_248.field_1._0_8_ >> 8);
    local_1f8[0xf] = (undefined1)local_248.field_1.textValue.super_StringPtr.content.size_;
    local_1f8._16_7_ = (undefined7)((ulong)local_248.field_1._8_8_ >> 8);
    local_248.field_1._24_8_ = local_248.field_1._48_8_;
    local_248.field_1._32_8_ = local_248.field_1._56_8_;
    local_248.field_1.textValue.super_StringPtr.content.size_ = uVar3;
    local_248.field_1._16_8_ = local_248.field_1._40_8_;
    local_248._0_8_ = uVar1;
    local_248.field_1.intValue = uVar2;
    local_258 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)&local_248);
    bVar4 = kj::operator==("u0f1s32",(StringPtr *)&local_258);
    if (!bVar4 && kj::_::Debug::minSeverity < 3) {
      local_248.field_1.listValue.reader.capTable = (CapTableReader *)local_1c1;
      local_248.field_1.listValue.reader.ptr = (byte *)pSStack_1b9;
      local_248.field_1.textValue.super_StringPtr.content.size_ = (size_t)local_1d1;
      local_248.field_1.listValue.reader.segment = &pSStack_1c9->super_SegmentReader;
      local_248._0_8_ = local_1f8._23_8_;
      local_248.field_1.intValue = (int64_t)pSStack_1d9;
      local_258 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)&local_248);
      kj::_::Debug::log<char_const(&)[58],char_const(&)[8],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x136,ERROR,
                 "\"failed: expected \" \"(\\\"u0f1s32\\\") == (w->getProto().getName())\", \"u0f1s32\", w->getProto().getName()"
                 ,(char (*) [58])"failed: expected (\"u0f1s32\") == (w->getProto().getName())",
                 (char (*) [8])"u0f1s32",(Reader *)&local_258);
    }
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[17]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x136,ERROR,"\"Maybe was empty.\"",(char (*) [17])"Maybe was empty.");
  }
  name_11.content.size_ = 8;
  name_11.content.ptr = "u0f1s32";
  DynamicStruct::Builder::get((Builder *)&local_248,(Builder *)&u,name_11);
  iVar7 = DynamicValue::Builder::AsImpl<int,_(capnp::Kind)0>::apply((Builder *)&local_248);
  DynamicValue::Builder::~Builder((Builder *)&local_248);
  if ((iVar7 != 0x12d687) && (kj::_::Debug::minSeverity < 3)) {
    local_1f8._0_4_ = 0x12d687;
    name_12.content.size_ = 8;
    name_12.content.ptr = "u0f1s32";
    DynamicStruct::Builder::get((Builder *)&local_248,(Builder *)&u,name_12);
    iVar7 = DynamicValue::Builder::AsImpl<int,_(capnp::Kind)0>::apply((Builder *)&local_248);
    local_258.ptr._0_4_ = iVar7;
    kj::_::Debug::log<char_const(&)[63],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x137,ERROR,
               "\"failed: expected \" \"(1234567) == (u.get(\\\"u0f1s32\\\").as<int32_t>())\", 1234567, u.get(\"u0f1s32\").as<int32_t>()"
               ,(char (*) [63])"failed: expected (1234567) == (u.get(\"u0f1s32\").as<int32_t>())",
               (int *)local_1f8,(int *)&local_258);
    DynamicValue::Builder::~Builder((Builder *)&local_248);
  }
  name_13.content.size_ = 7;
  name_13.content.ptr = "union1";
  DynamicStruct::Builder::get((Builder *)&local_248,(Builder *)&dynamic,name_13);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&u,(Builder *)&local_248);
  DynamicValue::Builder::~Builder((Builder *)&local_248);
  DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)&local_248,(Builder *)&u);
  uVar3 = local_248.field_1.listValue.reader.ptr;
  uVar2 = local_248.field_1.listValue.reader.capTable;
  uVar1 = local_248.field_1.listValue.reader.segment;
  if ((undefined1)local_248.type == VOID) {
    local_1c1 = (SegmentReader *)local_248.field_1._48_8_;
    pSStack_1b9 = (SegmentReader *)local_248.field_1._56_8_;
    local_1d1 = (SegmentReader *)local_248.field_1.listValue.reader.ptr;
    pSStack_1c9 = (SegmentBuilder *)local_248.field_1._40_8_;
    local_1f8._23_8_ = local_248.field_1.listValue.reader.segment;
    pSStack_1d9 = (SegmentReader *)local_248.field_1.listValue.reader.capTable;
    local_1f8[7] = (undefined1)local_248.field_1.intValue;
    local_1f8._8_7_ = (undefined7)((ulong)local_248.field_1._0_8_ >> 8);
    local_1f8[0xf] = (undefined1)local_248.field_1.textValue.super_StringPtr.content.size_;
    local_1f8._16_7_ = (undefined7)((ulong)local_248.field_1._8_8_ >> 8);
    local_248.field_1._24_8_ = local_248.field_1._48_8_;
    local_248.field_1._32_8_ = local_248.field_1._56_8_;
    local_248.field_1.textValue.super_StringPtr.content.size_ = uVar3;
    local_248.field_1._16_8_ = local_248.field_1._40_8_;
    local_248._0_8_ = uVar1;
    local_248.field_1.intValue = uVar2;
    local_258 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)&local_248);
    bVar4 = kj::operator==("u1f1sp",(StringPtr *)&local_258);
    if (!bVar4 && kj::_::Debug::minSeverity < 3) {
      local_248.field_1.listValue.reader.capTable = (CapTableReader *)local_1c1;
      local_248.field_1.listValue.reader.ptr = (byte *)pSStack_1b9;
      local_248.field_1.textValue.super_StringPtr.content.size_ = (size_t)local_1d1;
      local_248.field_1.listValue.reader.segment = &pSStack_1c9->super_SegmentReader;
      local_248._0_8_ = local_1f8._23_8_;
      local_248.field_1.intValue = (int64_t)pSStack_1d9;
      local_258 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)&local_248);
      kj::_::Debug::log<char_const(&)[57],char_const(&)[7],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x13b,ERROR,
                 "\"failed: expected \" \"(\\\"u1f1sp\\\") == (w->getProto().getName())\", \"u1f1sp\", w->getProto().getName()"
                 ,(char (*) [57])"failed: expected (\"u1f1sp\") == (w->getProto().getName())",
                 (char (*) [7])"u1f1sp",(Reader *)&local_258);
    }
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[17]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x13b,ERROR,"\"Maybe was empty.\"",(char (*) [17])"Maybe was empty.");
  }
  name_14.content.size_ = 7;
  name_14.content.ptr = "u1f1sp";
  DynamicStruct::Builder::get((Builder *)&local_248,(Builder *)&u,name_14);
  DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
            ((BuilderFor<Text> *)local_1f8,(Builder *)&local_248);
  bVar4 = capnp::operator==("foo",(Builder *)local_1f8);
  DynamicValue::Builder::~Builder((Builder *)&local_248);
  if (!bVar4 && kj::_::Debug::minSeverity < 3) {
    name_15.content.size_ = 7;
    name_15.content.ptr = "u1f1sp";
    DynamicStruct::Builder::get((Builder *)&local_248,(Builder *)&u,name_15);
    DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
              ((BuilderFor<Text> *)local_1f8,(Builder *)&local_248);
    kj::_::Debug::log<char_const(&)[57],char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x13c,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (u.get(\\\"u1f1sp\\\").as<Text>())\", \"foo\", u.get(\"u1f1sp\").as<Text>()"
               ,(char (*) [57])"failed: expected (\"foo\") == (u.get(\"u1f1sp\").as<Text>())",
               (char (*) [4])0x4f93d8,(BuilderFor<Text> *)local_1f8);
    DynamicValue::Builder::~Builder((Builder *)&local_248);
  }
  name_16.content.size_ = 7;
  name_16.content.ptr = "union2";
  DynamicStruct::Builder::get((Builder *)&local_248,(Builder *)&dynamic,name_16);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&u,(Builder *)&local_248);
  DynamicValue::Builder::~Builder((Builder *)&local_248);
  DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)&local_248,(Builder *)&u);
  uVar3 = local_248.field_1.listValue.reader.ptr;
  uVar2 = local_248.field_1.listValue.reader.capTable;
  uVar1 = local_248.field_1.listValue.reader.segment;
  if ((undefined1)local_248.type == VOID) {
    local_1c1 = (SegmentReader *)local_248.field_1._48_8_;
    pSStack_1b9 = (SegmentReader *)local_248.field_1._56_8_;
    local_1d1 = (SegmentReader *)local_248.field_1.listValue.reader.ptr;
    pSStack_1c9 = (SegmentBuilder *)local_248.field_1._40_8_;
    local_1f8._23_8_ = local_248.field_1.listValue.reader.segment;
    pSStack_1d9 = (SegmentReader *)local_248.field_1.listValue.reader.capTable;
    local_1f8[7] = (undefined1)local_248.field_1.intValue;
    local_1f8._8_7_ = (undefined7)((ulong)local_248.field_1._0_8_ >> 8);
    local_1f8[0xf] = (undefined1)local_248.field_1.textValue.super_StringPtr.content.size_;
    local_1f8._16_7_ = (undefined7)((ulong)local_248.field_1._8_8_ >> 8);
    local_248.field_1._24_8_ = local_248.field_1._48_8_;
    local_248.field_1._32_8_ = local_248.field_1._56_8_;
    local_248.field_1.textValue.super_StringPtr.content.size_ = uVar3;
    local_248.field_1._16_8_ = local_248.field_1._40_8_;
    local_248._0_8_ = uVar1;
    local_248.field_1.intValue = uVar2;
    local_258 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)&local_248);
    bVar4 = kj::operator==("u2f0s1",(StringPtr *)&local_258);
    if (!bVar4 && kj::_::Debug::minSeverity < 3) {
      local_248.field_1.listValue.reader.capTable = (CapTableReader *)local_1c1;
      local_248.field_1.listValue.reader.ptr = (byte *)pSStack_1b9;
      local_248.field_1.textValue.super_StringPtr.content.size_ = (size_t)local_1d1;
      local_248.field_1.listValue.reader.segment = &pSStack_1c9->super_SegmentReader;
      local_248._0_8_ = local_1f8._23_8_;
      local_248.field_1.intValue = (int64_t)pSStack_1d9;
      local_258 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)&local_248);
      kj::_::Debug::log<char_const(&)[57],char_const(&)[7],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x140,ERROR,
                 "\"failed: expected \" \"(\\\"u2f0s1\\\") == (w->getProto().getName())\", \"u2f0s1\", w->getProto().getName()"
                 ,(char (*) [57])"failed: expected (\"u2f0s1\") == (w->getProto().getName())",
                 (char (*) [7])"u2f0s1",(Reader *)&local_258);
    }
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[17]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x140,ERROR,"\"Maybe was empty.\"",(char (*) [17])"Maybe was empty.");
  }
  name_17.content.size_ = 7;
  name_17.content.ptr = "u2f0s1";
  DynamicStruct::Builder::get((Builder *)&local_248,(Builder *)&u,name_17);
  BVar6 = DynamicValue::Builder::AsImpl<bool,_(capnp::Kind)0>::apply((Builder *)&local_248);
  DynamicValue::Builder::~Builder((Builder *)&local_248);
  if (!BVar6 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[44]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x141,ERROR,"\"failed: expected \" \"u.get(\\\"u2f0s1\\\").as<bool>()\"",
               (char (*) [44])"failed: expected u.get(\"u2f0s1\").as<bool>()");
  }
  name_18.content.size_ = 7;
  name_18.content.ptr = "union3";
  DynamicStruct::Builder::get((Builder *)&local_248,(Builder *)&dynamic,name_18);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&u,(Builder *)&local_248);
  DynamicValue::Builder::~Builder((Builder *)&local_248);
  DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)&local_248,(Builder *)&u);
  uVar3 = local_248.field_1.listValue.reader.ptr;
  uVar2 = local_248.field_1.listValue.reader.capTable;
  uVar1 = local_248.field_1.listValue.reader.segment;
  if ((undefined1)local_248.type == VOID) {
    local_1c1 = (SegmentReader *)local_248.field_1._48_8_;
    pSStack_1b9 = (SegmentReader *)local_248.field_1._56_8_;
    local_1d1 = (SegmentReader *)local_248.field_1.listValue.reader.ptr;
    pSStack_1c9 = (SegmentBuilder *)local_248.field_1._40_8_;
    local_1f8._23_8_ = local_248.field_1.listValue.reader.segment;
    pSStack_1d9 = (SegmentReader *)local_248.field_1.listValue.reader.capTable;
    local_1f8[7] = (undefined1)local_248.field_1.intValue;
    local_1f8._8_7_ = (undefined7)((ulong)local_248.field_1._0_8_ >> 8);
    local_1f8[0xf] = (undefined1)local_248.field_1.textValue.super_StringPtr.content.size_;
    local_1f8._16_7_ = (undefined7)((ulong)local_248.field_1._8_8_ >> 8);
    local_248.field_1._24_8_ = local_248.field_1._48_8_;
    local_248.field_1._32_8_ = local_248.field_1._56_8_;
    local_248.field_1.textValue.super_StringPtr.content.size_ = uVar3;
    local_248.field_1._16_8_ = local_248.field_1._40_8_;
    local_248._0_8_ = uVar1;
    local_248.field_1.intValue = uVar2;
    local_258 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)&local_248);
    bVar4 = kj::operator==("u3f0s64",(StringPtr *)&local_258);
    if (!bVar4 && kj::_::Debug::minSeverity < 3) {
      local_248.field_1.listValue.reader.capTable = (CapTableReader *)local_1c1;
      local_248.field_1.listValue.reader.ptr = (byte *)pSStack_1b9;
      local_248.field_1.textValue.super_StringPtr.content.size_ = (size_t)local_1d1;
      local_248.field_1.listValue.reader.segment = &pSStack_1c9->super_SegmentReader;
      local_248._0_8_ = local_1f8._23_8_;
      local_248.field_1.intValue = (int64_t)pSStack_1d9;
      local_258 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)&local_248);
      kj::_::Debug::log<char_const(&)[58],char_const(&)[8],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x145,ERROR,
                 "\"failed: expected \" \"(\\\"u3f0s64\\\") == (w->getProto().getName())\", \"u3f0s64\", w->getProto().getName()"
                 ,(char (*) [58])"failed: expected (\"u3f0s64\") == (w->getProto().getName())",
                 (char (*) [8])"u3f0s64",(Reader *)&local_258);
    }
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[17]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x145,ERROR,"\"Maybe was empty.\"",(char (*) [17])"Maybe was empty.");
  }
  name_19.content.size_ = 8;
  name_19.content.ptr = "u3f0s64";
  DynamicStruct::Builder::get((Builder *)&local_248,(Builder *)&u,name_19);
  iVar8 = DynamicValue::Builder::AsImpl<long,_(capnp::Kind)0>::apply((Builder *)&local_248);
  DynamicValue::Builder::~Builder((Builder *)&local_248);
  if ((iVar8 != 0x112210f47de98115) && (kj::_::Debug::minSeverity < 3)) {
    local_1f8._0_4_ = 0x7de98115;
    local_1f8._4_4_ = 0x112210f4;
    name_20.content.size_ = 8;
    name_20.content.ptr = "u3f0s64";
    DynamicStruct::Builder::get((Builder *)&local_248,(Builder *)&u,name_20);
    pcVar9 = (char *)DynamicValue::Builder::AsImpl<long,_(capnp::Kind)0>::apply
                               ((Builder *)&local_248);
    local_258.ptr = pcVar9;
    kj::_::Debug::log<char_const(&)[77],long_long,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x146,ERROR,
               "\"failed: expected \" \"(1234567890123456789ll) == (u.get(\\\"u3f0s64\\\").as<int64_t>())\", 1234567890123456789ll, u.get(\"u3f0s64\").as<int64_t>()"
               ,(char (*) [77])
                "failed: expected (1234567890123456789ll) == (u.get(\"u3f0s64\").as<int64_t>())",
               (longlong *)local_1f8,(long *)&local_258);
    DynamicValue::Builder::~Builder((Builder *)&local_248);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(DynamicApi, UnionsRead) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestUnion>();

  root.getUnion0().setU0f1s32(1234567);
  root.getUnion1().setU1f1sp("foo");
  root.getUnion2().setU2f0s1(true);
  root.getUnion3().setU3f0s64(1234567890123456789ll);

  {
    auto dynamic = toDynamic(root.asReader());
    {
      auto u = dynamic.get("union0").as<DynamicStruct>();
      EXPECT_MAYBE_EQ(w, u.which(), "u0f1s32", w->getProto().getName());
      EXPECT_EQ(1234567, u.get("u0f1s32").as<int32_t>());
    }
    {
      auto u = dynamic.get("union1").as<DynamicStruct>();
      EXPECT_MAYBE_EQ(w, u.which(), "u1f1sp", w->getProto().getName());
      EXPECT_EQ("foo", u.get("u1f1sp").as<Text>());
    }
    {
      auto u = dynamic.get("union2").as<DynamicStruct>();
      EXPECT_MAYBE_EQ(w, u.which(), "u2f0s1", w->getProto().getName());
      EXPECT_TRUE(u.get("u2f0s1").as<bool>());
    }
    {
      auto u = dynamic.get("union3").as<DynamicStruct>();
      EXPECT_MAYBE_EQ(w, u.which(), "u3f0s64", w->getProto().getName());
      EXPECT_EQ(1234567890123456789ll, u.get("u3f0s64").as<int64_t>());
    }
  }

  {
    // Again as a builder.
    auto dynamic = toDynamic(root);
    {
      auto u = dynamic.get("union0").as<DynamicStruct>();
      EXPECT_MAYBE_EQ(w, u.which(), "u0f1s32", w->getProto().getName());
      EXPECT_EQ(1234567, u.get("u0f1s32").as<int32_t>());
    }
    {
      auto u = dynamic.get("union1").as<DynamicStruct>();
      EXPECT_MAYBE_EQ(w, u.which(), "u1f1sp", w->getProto().getName());
      EXPECT_EQ("foo", u.get("u1f1sp").as<Text>());
    }
    {
      auto u = dynamic.get("union2").as<DynamicStruct>();
      EXPECT_MAYBE_EQ(w, u.which(), "u2f0s1", w->getProto().getName());
      EXPECT_TRUE(u.get("u2f0s1").as<bool>());
    }
    {
      auto u = dynamic.get("union3").as<DynamicStruct>();
      EXPECT_MAYBE_EQ(w, u.which(), "u3f0s64", w->getProto().getName());
      EXPECT_EQ(1234567890123456789ll, u.get("u3f0s64").as<int64_t>());
    }
  }
}